

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdFreeSplitTxOutHandle(void *handle,void *split_output_handle)

{
  _Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *this;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if (split_output_handle != (void *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"SplitTxOut",&local_39);
    cfd::capi::CheckBuffer(split_output_handle,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this = *(_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> **)
            ((long)split_output_handle + 0x18);
    if (this != (_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)0x0) {
      std::_Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~_Vector_base(this);
      operator_delete(this);
      *(undefined8 *)((long)split_output_handle + 0x18) = 0;
    }
    this_00 = *(vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> **)
               ((long)split_output_handle + 0x20);
    if (this_00 != (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)0x0) {
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(this_00);
      operator_delete(this_00);
      *(undefined8 *)((long)split_output_handle + 0x20) = 0;
    }
    this_01 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                **)((long)split_output_handle + 0x28);
    if (this_01 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_01);
      operator_delete(this_01);
      *(undefined8 *)((long)split_output_handle + 0x28) = 0;
    }
  }
  std::__cxx11::string::string((string *)&local_38,"SplitTxOut",&local_39);
  cfd::capi::FreeBuffer(split_output_handle,&local_38,0x30);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeSplitTxOutHandle(void* handle, void* split_output_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (split_output_handle != nullptr) {
      CheckBuffer(split_output_handle, kPrefixSplitTxOut);
      CfdCapiSplitTxOutData* data =
          static_cast<CfdCapiSplitTxOutData*>(split_output_handle);
      if (data->amount_list != nullptr) {
        delete data->amount_list;
        data->amount_list = nullptr;
      }
      if (data->locking_script_list != nullptr) {
        delete data->locking_script_list;
        data->locking_script_list = nullptr;
      }
      if (data->nonce_list != nullptr) {
        delete data->nonce_list;
        data->nonce_list = nullptr;
      }
    }
    FreeBuffer(
        split_output_handle, kPrefixSplitTxOut, sizeof(CfdCapiSplitTxOutData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}